

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_33c573::BuildEngineImpl::breakCycle
          (BuildEngineImpl *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycleList)

{
  BuildEngineDelegate *pBVar1;
  bool bVar2;
  uint uVar3;
  reference ppRVar4;
  RuleInfo *this_00;
  pointer pRVar5;
  pointer pBVar6;
  pointer toTask;
  pointer pTVar7;
  reference __x;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *this_01;
  reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
  local_c8;
  TaskInputRequest *local_c0;
  const_iterator local_b8;
  TaskInputRequest *local_b0;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
  local_a8;
  const_iterator local_a0;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
  local_98;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
  local_90;
  iterator it_1;
  reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
  local_80;
  RuleInfo *local_78;
  RuleInfo *nextRuleInfo;
  TaskInfo *taskInfo;
  const_iterator local_60;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
  local_58;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
  local_50;
  iterator it;
  RuleInfo *ruleInfo;
  const_reverse_iterator ruleIt;
  TracingEngineQueueItemEvent _;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycleList_local;
  BuildEngineImpl *this_local;
  
  llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
            ((TracingEngineQueueItemEvent *)&ruleIt,BreakingCycle,"0");
  std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::rbegin
            ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
             &stack0xffffffffffffffd0);
  do {
    std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::rend
              ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&ruleInfo);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                             *)&stack0xffffffffffffffd0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                             *)&ruleInfo);
    if (!bVar2) {
      this_local._7_1_ = false;
LAB_002e3c0e:
      it._M_current._4_4_ = 1;
      llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                ((TracingEngineQueueItemEvent *)&ruleIt);
      return this_local._7_1_;
    }
    ppRVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                           *)&stack0xffffffffffffffd0);
    this_00 = getRuleInfoForKey(this,&(*ppRVar4)->key);
    bVar2 = RuleInfo::isScanning(this_00);
    if (bVar2) {
      pBVar1 = this->delegate;
      pRVar5 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::get
                         (&this_00->rule);
      uVar3 = (*pBVar1->_vptr_BuildEngineDelegate[5])(pBVar1,cycleList,pRVar5,0);
      if ((uVar3 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar2) {
          pBVar6 = std::
                   unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   ::operator->(&this->trace);
          pRVar5 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get(&this_00->rule);
          llbuild::core::BuildEngineTrace::cycleForceRuleNeedsToRun(pBVar6,pRVar5);
        }
        local_50._M_current =
             (RuleScanRequest *)findRuleScanRequestForRule(this,&this->ruleInfosToScan,this_00);
        local_58._M_current =
             (RuleScanRequest *)
             std::
             vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
             ::end(&this->ruleInfosToScan);
        bVar2 = __gnu_cxx::operator!=(&local_50,&local_58);
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>>>
          ::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest*>
                    ((__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>>>
                      *)&local_60,&local_50);
          taskInfo = (TaskInfo *)
                     std::
                     vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                     ::erase(&this->ruleInfosToScan,local_60);
        }
        finishScanRequest(this,this_00,NeedsToRun);
        pBVar1 = this->delegate;
        pRVar5 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&this_00->rule);
        (*pBVar1->_vptr_BuildEngineDelegate[4])(pBVar1,pRVar5,4,0);
        this_00->wasForced = true;
        this_local._7_1_ = true;
      }
      goto LAB_002e3c0e;
    }
    bVar2 = RuleInfo::isInProgressWaiting(this_00);
    if ((bVar2) && ((this_00->result).builtAt != 0)) {
      nextRuleInfo = (RuleInfo *)RuleInfo::getPendingTaskInfo(this_00);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
      ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                          *)&it_1,(reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                                   *)&stack0xffffffffffffffd0);
      std::
      next<std::reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule*const*,std::vector<llbuild::core::Rule*,std::allocator<llbuild::core::Rule*>>>>>
                (&local_80,(difference_type)&it_1);
      ppRVar4 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
                ::operator*(&local_80);
      local_78 = getRuleInfoForKey(this,&(*ppRVar4)->key);
      local_90._M_current =
           (TaskInputRequest *)
           findTaskInputRequestForRule
                     (this,(vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                            *)&nextRuleInfo->rule,local_78);
      local_98._M_current =
           (TaskInputRequest *)
           std::
           vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
           ::end((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  *)&nextRuleInfo->rule);
      bVar2 = __gnu_cxx::operator==(&local_90,&local_98);
      if (!bVar2) {
        pBVar1 = this->delegate;
        pRVar5 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&this_00->rule);
        uVar3 = (*pBVar1->_vptr_BuildEngineDelegate[5])(pBVar1,cycleList,pRVar5,1);
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar2) {
            pBVar6 = std::
                     unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                     ::operator->(&this->trace);
            pRVar5 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                     ::get(&this_00->rule);
            pTVar7 = __gnu_cxx::
                     __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                     ::operator->(&local_90);
            toTask = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                     ::get(&pTVar7->taskInfo->task);
            llbuild::core::BuildEngineTrace::cycleSupplyPriorValue(pBVar6,pRVar5,toTask);
          }
          pTVar7 = __gnu_cxx::
                   __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                   ::operator->(&local_90);
          pTVar7->forcePriorValue = true;
          local_a8._M_current =
               (TaskInputRequest *)
               std::
               vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ::end(&this->finishedInputRequests);
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
          ::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest*>
                    ((__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
                      *)&local_a0,&local_a8);
          __x = __gnu_cxx::
                __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                ::operator*(&local_90);
          local_b0 = (TaskInputRequest *)
                     std::
                     vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ::insert(&this->finishedInputRequests,local_a0,__x);
          this_01 = &nextRuleInfo->rule;
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
          ::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest*>
                    ((__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
                      *)&local_b8,&local_90);
          local_c0 = (TaskInputRequest *)
                     std::
                     vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ::erase((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                              *)this_01,local_b8);
          this_local._7_1_ = true;
        }
        goto LAB_002e3c0e;
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>
    ::operator++(&local_c8,(int)&stack0xffffffffffffffd0);
  } while( true );
}

Assistant:

bool breakCycle(const std::vector<Rule*>& cycleList) {
    // BreakingCycle doesn't need a key since it will not be called in parallel
    TracingEngineQueueItemEvent _(EngineQueueItemKind::BreakingCycle, "0");

    // Search the cycle for potential means for breaking the cycle. Right now
    // we use two principle approaches, force a rule to be built (skipping
    // scanning its dependencies) and supply a previously built result.
    for (auto ruleIt = cycleList.rbegin(); ruleIt != cycleList.rend(); ruleIt++) {
      auto& ruleInfo = getRuleInfoForKey((*ruleIt)->key);

      // If this rule is scanning, try to force a rebuild to break the cycle
      if (ruleInfo.isScanning()) {
        // Ask the delegate if we should try to resolve this cycle by forcing
        // a rule to be built?
        if (!delegate.shouldResolveCycle(cycleList, ruleInfo.rule.get(), Rule::CycleAction::ForceBuild))
          return false;

        if (trace) {
          trace->cycleForceRuleNeedsToRun(ruleInfo.rule.get());
        }

        // Find the rule scan request, if not already deferred, for this rule
        // and remove it. If the rule scan request was already deferred, we use
        // the wasForced condition to ignore it later.
        auto it = findRuleScanRequestForRule(ruleInfosToScan, &ruleInfo);
        if (it != ruleInfosToScan.end()) {
          ruleInfosToScan.erase(it);
        }

        // mark this rule as needs to run (forced)
        finishScanRequest(ruleInfo, RuleInfo::StateKind::NeedsToRun);
        delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::Forced, nullptr);
        ruleInfo.wasForced = true;

        return true;
      }

      // Check if this rule has a (potentially) valid previous result and if so
      // try to provide it to the node requesting it to break the cycle.
      if (ruleInfo.isInProgressWaiting() && ruleInfo.result.builtAt != 0) {
        auto* taskInfo = ruleInfo.getPendingTaskInfo();

        // find downstream node in the cycle that wants this input
        auto& nextRuleInfo = getRuleInfoForKey((*std::next(ruleIt))->key);

        // find the corresponding request on this task
        auto it = findTaskInputRequestForRule(taskInfo->requestedBy, &nextRuleInfo);
        if (it == taskInfo->requestedBy.end()) {
          // this rule has not generated an input request yet, so we cannot
          // provide a value to it
          continue;
        }

        // Ask the delegate if we should try to resolve this cycle by supplying
        // a prior value?
        if (!delegate.shouldResolveCycle(cycleList, ruleInfo.rule.get(), Rule::CycleAction::SupplyPriorValue))
          return false;

        // supply the prior value to the node
        if (trace) {
          trace->cycleSupplyPriorValue(ruleInfo.rule.get(), it->taskInfo->task.get());
        }
        it->forcePriorValue = true;
        finishedInputRequests.insert(finishedInputRequests.end(), *it);

        // remove this request from the task info
        taskInfo->requestedBy.erase(it);
        return true;
      }
    }

    return false;
  }